

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O0

void __thiscall HighsDomain::conflictAnalysis(HighsDomain *this,HighsConflictPool *conflictPool)

{
  bool bVar1;
  pointer pHVar2;
  ConflictSet *in_RDI;
  ConflictSet conflictSet;
  HighsDomain *in_stack_000001b8;
  HighsDomain *in_stack_ffffffffffffff38;
  ConflictSet *in_stack_ffffffffffffff40;
  HighsConflictPool *in_stack_ffffffffffffff88;
  ConflictSet *in_stack_ffffffffffffff90;
  
  pHVar2 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x5c9b07);
  if (&pHVar2->domain != (HighsDomain *)in_RDI) {
    pHVar2 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x5c9b34);
    bVar1 = infeasible(&pHVar2->domain);
    if ((!bVar1) &&
       (((ulong)in_RDI[3].reconvergenceFrontier._M_t._M_impl.super__Rb_tree_header._M_header._M_left
        & 1) != 0)) {
      std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                 0x5c9b72);
      propagate(in_stack_000001b8);
      pHVar2 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
               operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           *)0x5c9b99);
      bVar1 = infeasible(&pHVar2->domain);
      if (!bVar1) {
        ConflictSet::ConflictSet(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        ConflictSet::conflictAnalysis(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        ConflictSet::~ConflictSet(in_RDI);
      }
    }
  }
  return;
}

Assistant:

void HighsDomain::conflictAnalysis(HighsConflictPool& conflictPool) {
  if (&mipsolver->mipdata_->domain == this) return;
  if (mipsolver->mipdata_->domain.infeasible() || !infeasible_) return;

  mipsolver->mipdata_->domain.propagate();
  if (mipsolver->mipdata_->domain.infeasible()) return;

  ConflictSet conflictSet(*this);

  conflictSet.conflictAnalysis(conflictPool);
}